

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O1

bool __thiscall ON_PointGrid::IsValid(ON_PointGrid *this,ON_TextLog *text_log)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = false;
  bVar1 = ON_IsValidPointGrid(3,false,this->m_point_count[0],this->m_point_count[1],
                              this->m_point_stride0 * 3,3,
                              &((this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a)->x);
  if (bVar1) {
    bVar2 = this->m_point_count[0] * this->m_point_stride0 <=
            (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_count;
  }
  return bVar2;
}

Assistant:

bool ON_PointGrid::IsValid( ON_TextLog* text_log ) const
{
  bool rc = false;
  if ( ON_IsValidPointGrid( 3, false, 
                            m_point_count[0], m_point_count[1], 
                            m_point_stride0*3, 3, 
                            &m_point[0].x ) ) 
  {
    if ( m_point.Count() >= m_point_stride0*m_point_count[0] )
      rc = true;
  }
  return rc;
}